

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::EndTable(void)

{
  ImSpan<ImGuiTableColumn> *this;
  float fVar1;
  uint uVar2;
  ImGuiWindow *window;
  ImGuiWindow *pIVar3;
  float fVar4;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  int iVar8;
  ImGuiTableColumn *pIVar9;
  ImVec4 *pIVar10;
  uint *puVar11;
  ImGuiPtrOrIndex *pIVar12;
  ImGuiTable *pIVar13;
  int column_n;
  ulong uVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  ImVec2 local_38;
  
  pIVar6 = GImGui;
  pIVar13 = GImGui->CurrentTable;
  if (pIVar13 == (ImGuiTable *)0x0) {
    __assert_fail("table != __null && \"Only call EndTable() if BeginTable() returns true!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x48c,"void ImGui::EndTable()");
  }
  if (pIVar13->IsLayoutLocked == false) {
    TableUpdateLayout(pIVar13);
  }
  window = pIVar13->InnerWindow;
  if (window != pIVar6->CurrentWindow) {
    __assert_fail("inner_window == g.CurrentWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x49a,"void ImGui::EndTable()");
  }
  uVar2 = pIVar13->Flags;
  pIVar3 = pIVar13->OuterWindow;
  if ((pIVar3 != window) && (pIVar3 != window->ParentWindow)) {
    __assert_fail("outer_window == inner_window || outer_window == inner_window->ParentWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x49b,"void ImGui::EndTable()");
  }
  if (pIVar13->IsInsideRow == true) {
    TableEndRow(pIVar13);
  }
  if (((uVar2 & 0x20) != 0) && (pIVar13->HoveredColumnBody != -1)) {
    bVar7 = IsAnyItemHovered();
    if (!bVar7) {
      bVar7 = IsMouseReleased(1);
      if (bVar7) {
        TableOpenContextMenu((int)pIVar13->HoveredColumnBody);
      }
    }
  }
  (window->DC).PrevLineSize = pIVar13->HostBackupPrevLineSize;
  (window->DC).CurrLineSize = pIVar13->HostBackupCurrLineSize;
  (window->DC).CursorMaxPos = pIVar13->HostBackupCursorMaxPos;
  fVar1 = pIVar13->RowPosY2;
  fVar15 = (window->DC).CursorPos.y;
  if ((fVar1 != fVar15) || (NAN(fVar1) || NAN(fVar15))) {
    __assert_fail("table->RowPosY2 == inner_window->DC.CursorPos.y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x4aa,"void ImGui::EndTable()");
  }
  auVar21 = ZEXT416((uint)fVar1);
  if (pIVar3 == window) {
    if ((uVar2 >> 0x11 & 1) == 0) {
      auVar16 = ZEXT416((uint)(pIVar13->OuterRect).Max.y);
      auVar17 = vcmpss_avx(auVar21,auVar16,2);
      auVar17 = vblendvps_avx(auVar21,auVar16,auVar17);
      (pIVar13->InnerRect).Max.y = auVar17._0_4_;
      (pIVar13->OuterRect).Max.y = auVar17._0_4_;
    }
  }
  else {
    (window->DC).CursorMaxPos.y = fVar1;
  }
  fVar15 = (pIVar13->OuterRect).Max.y;
  auVar16 = ZEXT416((uint)(pIVar13->WorkRect).Max.y);
  auVar17 = vcmpss_avx(ZEXT416((uint)fVar15),auVar16,2);
  auVar17 = vblendvps_avx(ZEXT416((uint)fVar15),auVar16,auVar17);
  (pIVar13->WorkRect).Max.y = auVar17._0_4_;
  pIVar13->LastOuterHeight = fVar15 - (pIVar13->OuterRect).Min.y;
  if (((uint)pIVar13->Flags >> 0x18 & 1) != 0) {
    fVar15 = (pIVar13->InnerWindow->DC).CursorMaxPos.x;
    auVar23 = ZEXT464((uint)fVar15);
    if (pIVar13->RightMostEnabledColumn != -1) {
      fVar20 = 0.0;
      if (((uint)pIVar13->Flags >> 10 & 1) != 0) {
        fVar20 = 1.0;
      }
      pIVar9 = ImSpan<ImGuiTableColumn>::operator[]
                         (&pIVar13->Columns,(int)pIVar13->RightMostEnabledColumn);
      auVar16 = ZEXT416((uint)((pIVar9->WorkMaxX + pIVar13->CellPaddingX + pIVar13->OuterPaddingX) -
                              fVar20));
      auVar17 = vcmpss_avx(auVar16,ZEXT416((uint)fVar15),2);
      auVar17 = vblendvps_avx(auVar16,ZEXT416((uint)fVar15),auVar17);
      auVar23 = ZEXT1664(auVar17);
    }
    if (pIVar13->ResizedColumn != -1) {
      auVar17 = vcmpss_avx(ZEXT416((uint)pIVar13->ResizeLockMinContentsX2),auVar23._0_16_,2);
      auVar17 = vblendvps_avx(ZEXT416((uint)pIVar13->ResizeLockMinContentsX2),auVar23._0_16_,auVar17
                             );
      auVar23 = ZEXT1664(auVar17);
    }
    (pIVar13->InnerWindow->DC).CursorMaxPos.x = auVar23._0_4_;
  }
  if ((uVar2 >> 0x14 & 1) == 0) {
    ImDrawList::PopClipRect(window->DrawList);
  }
  pIVar10 = ImVector<ImVec4>::back(&window->DrawList->_ClipRectStack);
  fVar15 = pIVar10->y;
  fVar20 = pIVar10->z;
  fVar4 = pIVar10->w;
  (window->ClipRect).Min.x = pIVar10->x;
  (window->ClipRect).Min.y = fVar15;
  (window->ClipRect).Max.x = fVar20;
  (window->ClipRect).Max.y = fVar4;
  if ((uVar2 & 0x780) != 0) {
    TableDrawBorders(pIVar13);
  }
  ImDrawListSplitter::SetCurrentChannel(&pIVar13->DrawSplitter,window->DrawList,0);
  if ((pIVar13->Flags & 0x100000) == 0) {
    TableMergeDrawChannels(pIVar13);
  }
  ImDrawListSplitter::Merge(&pIVar13->DrawSplitter,window->DrawList);
  pIVar13->ColumnsAutoFitWidth =
       (pIVar13->CellPaddingX + pIVar13->CellPaddingX) * (float)(int)pIVar13->ColumnsEnabledCount +
       pIVar13->OuterPaddingX + pIVar13->OuterPaddingX +
       (pIVar13->CellSpacingX1 + pIVar13->CellSpacingX2) *
       (float)(pIVar13->ColumnsEnabledCount + -1);
  this = &pIVar13->Columns;
  for (uVar14 = 0; (long)uVar14 < (long)pIVar13->ColumnsCount; uVar14 = uVar14 + 1) {
    if ((pIVar13->EnabledMaskByIndex >> (uVar14 & 0x3f) & 1) != 0) {
      pIVar9 = ImSpan<ImGuiTableColumn>::operator[](this,(int)uVar14);
      if ((pIVar9->Flags & 0x18U) == 8) {
        fVar15 = pIVar9->WidthRequest;
      }
      else {
        fVar15 = TableGetColumnWidthAuto(pIVar13,pIVar9);
      }
      pIVar13->ColumnsAutoFitWidth = fVar15 + pIVar13->ColumnsAutoFitWidth;
    }
  }
  if ((pIVar3 == window) || ((pIVar13->Flags & 0x1000000U) != 0)) {
    if ((pIVar13->LastResizedColumn != -1) &&
       (((pIVar13->ResizedColumn == -1 && (window->ScrollbarX == true)) &&
        (pIVar13->InstanceInteracted == pIVar13->InstanceCurrent)))) {
      fVar20 = pIVar13->CellPaddingX + pIVar13->CellPaddingX + pIVar13->MinColumnWidth;
      pIVar9 = ImSpan<ImGuiTableColumn>::operator[](this,(int)pIVar13->LastResizedColumn);
      fVar15 = pIVar9->MaxX;
      if ((pIVar13->InnerClipRect).Min.x <= fVar15) {
        if (fVar15 <= (pIVar13->InnerClipRect).Max.x) goto LAB_00187d55;
        fVar20 = fVar20 + (fVar15 - (window->Pos).x);
      }
      else {
        fVar20 = (fVar15 - (window->Pos).x) - fVar20;
      }
      SetScrollFromPosX(window,fVar20,1.0);
    }
  }
  else {
    (window->Scroll).x = 0.0;
  }
LAB_00187d55:
  if ((pIVar13->ResizedColumn != -1) && (pIVar13->InstanceCurrent == pIVar13->InstanceInteracted)) {
    pIVar9 = ImSpan<ImGuiTableColumn>::operator[](this,(int)pIVar13->ResizedColumn);
    auVar17 = vcvtdq2ps_avx(ZEXT416((uint)(int)((((((pIVar6->IO).MousePos.x -
                                                   (pIVar6->ActiveIdClickOffset).x) + 4.0) -
                                                 pIVar9->MinX) - pIVar13->CellSpacingX1) -
                                               (pIVar13->CellPaddingX + pIVar13->CellPaddingX))));
    pIVar13->ResizedColumnNextWidth = auVar17._0_4_;
  }
  puVar11 = ImVector<unsigned_int>::back(&window->IDStack);
  if (*puVar11 != (int)pIVar13->InstanceCurrent + pIVar13->ID) {
    __assert_fail("(inner_window->IDStack.back() == table->ID + table->InstanceCurrent) && \"Mismatching PushID/PopID!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x503,"void ImGui::EndTable()");
  }
  if ((pIVar3->DC).ItemWidthStack.Size < pIVar13->HostBackupItemWidthStackSize) {
    __assert_fail("(outer_window->DC.ItemWidthStack.Size >= table->HostBackupItemWidthStackSize) && \"Too many PopItemWidth!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x504,"void ImGui::EndTable()");
  }
  PopID();
  auVar17 = ZEXT416((uint)(pIVar3->DC).CursorMaxPos.x);
  auVar16 = ZEXT416((uint)(pIVar3->DC).CursorMaxPos.y);
  IVar5 = (pIVar13->HostBackupWorkRect).Max;
  (window->WorkRect).Min = (pIVar13->HostBackupWorkRect).Min;
  (window->WorkRect).Max = IVar5;
  IVar5 = (pIVar13->HostBackupParentWorkRect).Max;
  (window->ParentWorkRect).Min = (pIVar13->HostBackupParentWorkRect).Min;
  (window->ParentWorkRect).Max = IVar5;
  window->SkipItems = pIVar13->HostSkipItems;
  (pIVar3->DC).CursorPos = (pIVar13->OuterRect).Min;
  (pIVar3->DC).ItemWidth = pIVar13->HostBackupItemWidth;
  (pIVar3->DC).ItemWidthStack.Size = pIVar13->HostBackupItemWidthStackSize;
  (pIVar3->DC).ColumnsOffset.x = (pIVar13->HostBackupColumnsOffset).x;
  if (pIVar3 == window) {
    auVar19._8_8_ = 0;
    auVar19._0_4_ = (pIVar13->OuterRect).Min.x;
    auVar19._4_4_ = (pIVar13->OuterRect).Min.y;
    auVar18._8_8_ = 0;
    auVar18._0_4_ = (pIVar13->OuterRect).Max.x;
    auVar18._4_4_ = (pIVar13->OuterRect).Max.y;
    auVar19 = vsubps_avx(auVar18,auVar19);
    local_38 = (ImVec2)vmovlps_avx(auVar19);
    ItemSize(&local_38,-1.0);
    ItemAdd(&pIVar13->OuterRect,0,(ImRect *)0x0);
  }
  else {
    EndChild();
  }
  uVar2 = pIVar13->Flags;
  if ((uVar2 >> 0x10 & 1) == 0) {
    fVar15 = (pIVar13->UserOuterSize).x;
    fVar20 = 0.0;
    if (fVar15 <= 0.0) {
      if ((uVar2 >> 0x18 & 1) != 0) {
        fVar20 = (window->ScrollbarSizes).x;
      }
      fVar4 = (pIVar13->OuterRect).Min.x + pIVar13->ColumnsAutoFitWidth;
      auVar18 = ZEXT416((uint)((fVar20 + fVar4) - fVar15));
      auVar22 = ZEXT416((uint)(pIVar3->DC).IdealMaxPos.x);
      auVar19 = vcmpss_avx(auVar18,auVar22,2);
      auVar19 = vblendvps_avx(auVar18,auVar22,auVar19);
      (pIVar3->DC).IdealMaxPos.x = auVar19._0_4_;
      auVar19 = vminss_avx(ZEXT416((uint)(pIVar13->OuterRect).Max.x),ZEXT416((uint)fVar4));
    }
    else {
      auVar19 = ZEXT416((uint)(pIVar13->OuterRect).Max.x);
    }
  }
  else {
    if ((uVar2 >> 0x18 & 1) != 0) {
      __assert_fail("(table->Flags & ImGuiTableFlags_ScrollX) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                    ,0x523,"void ImGui::EndTable()");
    }
    auVar19 = ZEXT416((uint)((pIVar13->OuterRect).Min.x + pIVar13->ColumnsAutoFitWidth));
  }
  auVar18 = vcmpss_avx(auVar19,auVar17,2);
  auVar17 = vblendvps_avx(auVar19,auVar17,auVar18);
  (pIVar3->DC).CursorMaxPos.x = auVar17._0_4_;
  fVar15 = (pIVar13->UserOuterSize).y;
  fVar20 = 0.0;
  if (fVar15 <= 0.0) {
    if ((uVar2 >> 0x19 & 1) != 0) {
      fVar20 = (window->ScrollbarSizes).y;
    }
    auVar19 = ZEXT416((uint)((fVar1 + fVar20) - fVar15));
    auVar18 = ZEXT416((uint)(pIVar3->DC).IdealMaxPos.y);
    auVar17 = vcmpss_avx(auVar19,auVar18,2);
    auVar17 = vblendvps_avx(auVar19,auVar18,auVar17);
    (pIVar3->DC).IdealMaxPos.y = auVar17._0_4_;
    auVar21 = vminss_avx(ZEXT416((uint)(pIVar13->OuterRect).Max.y),auVar21);
  }
  else {
    auVar21 = ZEXT416((uint)(pIVar13->OuterRect).Max.y);
  }
  auVar17 = vcmpss_avx(auVar21,auVar16,2);
  auVar21 = vblendvps_avx(auVar21,auVar16,auVar17);
  (pIVar3->DC).CursorMaxPos.y = auVar21._0_4_;
  if (pIVar13->IsSettingsDirty == true) {
    TableSaveSettings(pIVar13);
  }
  pIVar13->IsInitializing = false;
  if ((pIVar6->CurrentWindow == pIVar3) && (pIVar6->CurrentTable == pIVar13)) {
    ImVector<ImGuiPtrOrIndex>::pop_back(&pIVar6->CurrentTableStack);
    if ((pIVar6->CurrentTableStack).Size == 0) {
      pIVar6->CurrentTable = (ImGuiTable *)0x0;
      iVar8 = -1;
    }
    else {
      pIVar12 = ImVector<ImGuiPtrOrIndex>::back(&pIVar6->CurrentTableStack);
      pIVar13 = ImVector<ImGuiTable>::operator[](&(pIVar6->Tables).Buf,pIVar12->Index);
      pIVar6->CurrentTable = pIVar13;
      iVar8 = ImPool<ImGuiTable>::GetIndex(&pIVar6->Tables,pIVar13);
    }
    (pIVar3->DC).CurrentTableIdx = iVar8;
    return;
  }
  __assert_fail("g.CurrentWindow == outer_window && g.CurrentTable == table",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                ,0x542,"void ImGui::EndTable()");
}

Assistant:

void    ImGui::EndTable()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Only call EndTable() if BeginTable() returns true!");

    // This assert would be very useful to catch a common error... unfortunately it would probably trigger in some
    // cases, and for consistency user may sometimes output empty tables (and still benefit from e.g. outer border)
    //IM_ASSERT(table->IsLayoutLocked && "Table unused: never called TableNextRow(), is that the intent?");

    // If the user never got to call TableNextRow() or TableNextColumn(), we call layout ourselves to ensure all our
    // code paths are consistent (instead of just hoping that TableBegin/TableEnd will work), get borders drawn, etc.
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    const ImGuiTableFlags flags = table->Flags;
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    IM_ASSERT(inner_window == g.CurrentWindow);
    IM_ASSERT(outer_window == inner_window || outer_window == inner_window->ParentWindow);

    if (table->IsInsideRow)
        TableEndRow(table);

    // Context menu in columns body
    if (flags & ImGuiTableFlags_ContextMenuInBody)
        if (table->HoveredColumnBody != -1 && !IsAnyItemHovered() && IsMouseReleased(ImGuiMouseButton_Right))
            TableOpenContextMenu((int)table->HoveredColumnBody);

    // Finalize table height
    inner_window->DC.PrevLineSize = table->HostBackupPrevLineSize;
    inner_window->DC.CurrLineSize = table->HostBackupCurrLineSize;
    inner_window->DC.CursorMaxPos = table->HostBackupCursorMaxPos;
    const float inner_content_max_y = table->RowPosY2;
    IM_ASSERT(table->RowPosY2 == inner_window->DC.CursorPos.y);
    if (inner_window != outer_window)
        inner_window->DC.CursorMaxPos.y = inner_content_max_y;
    else if (!(flags & ImGuiTableFlags_NoHostExtendY))
        table->OuterRect.Max.y = table->InnerRect.Max.y = ImMax(table->OuterRect.Max.y, inner_content_max_y); // Patch OuterRect/InnerRect height
    table->WorkRect.Max.y = ImMax(table->WorkRect.Max.y, table->OuterRect.Max.y);
    table->LastOuterHeight = table->OuterRect.GetHeight();

    // Setup inner scrolling range
    // FIXME: This ideally should be done earlier, in BeginTable() SetNextWindowContentSize call, just like writing to inner_window->DC.CursorMaxPos.y,
    // but since the later is likely to be impossible to do we'd rather update both axises together.
    if (table->Flags & ImGuiTableFlags_ScrollX)
    {
        const float outer_padding_for_border = (table->Flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
        float max_pos_x = table->InnerWindow->DC.CursorMaxPos.x;
        if (table->RightMostEnabledColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->Columns[table->RightMostEnabledColumn].WorkMaxX + table->CellPaddingX + table->OuterPaddingX - outer_padding_for_border);
        if (table->ResizedColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->ResizeLockMinContentsX2);
        table->InnerWindow->DC.CursorMaxPos.x = max_pos_x;
    }

    // Pop clipping rect
    if (!(flags & ImGuiTableFlags_NoClip))
        inner_window->DrawList->PopClipRect();
    inner_window->ClipRect = inner_window->DrawList->_ClipRectStack.back();

    // Draw borders
    if ((flags & ImGuiTableFlags_Borders) != 0)
        TableDrawBorders(table);

#if 0
    // Strip out dummy channel draw calls
    // We have no way to prevent user submitting direct ImDrawList calls into a hidden column (but ImGui:: calls will be clipped out)
    // Pros: remove draw calls which will have no effect. since they'll have zero-size cliprect they may be early out anyway.
    // Cons: making it harder for users watching metrics/debugger to spot the wasted vertices.
    if (table->DummyDrawChannel != (ImGuiTableColumnIdx)-1)
    {
        ImDrawChannel* dummy_channel = &table->DrawSplitter._Channels[table->DummyDrawChannel];
        dummy_channel->_CmdBuffer.resize(0);
        dummy_channel->_IdxBuffer.resize(0);
    }
#endif

    // Flatten channels and merge draw calls
    table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, 0);
    if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
        TableMergeDrawChannels(table);
    table->DrawSplitter.Merge(inner_window->DrawList);

    // Update ColumnsAutoFitWidth to get us ahead for host using our size to auto-resize without waiting for next BeginTable()
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    table->ColumnsAutoFitWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (table->EnabledMaskByIndex & ((ImU64)1 << column_n))
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !(column->Flags & ImGuiTableColumnFlags_NoResize))
                table->ColumnsAutoFitWidth += column->WidthRequest;
            else
                table->ColumnsAutoFitWidth += TableGetColumnWidthAuto(table, column);
        }

    // Update scroll
    if ((table->Flags & ImGuiTableFlags_ScrollX) == 0 && inner_window != outer_window)
    {
        inner_window->Scroll.x = 0.0f;
    }
    else if (table->LastResizedColumn != -1 && table->ResizedColumn == -1 && inner_window->ScrollbarX && table->InstanceInteracted == table->InstanceCurrent)
    {
        // When releasing a column being resized, scroll to keep the resulting column in sight
        const float neighbor_width_to_keep_visible = table->MinColumnWidth + table->CellPaddingX * 2.0f;
        ImGuiTableColumn* column = &table->Columns[table->LastResizedColumn];
        if (column->MaxX < table->InnerClipRect.Min.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x - neighbor_width_to_keep_visible, 1.0f);
        else if (column->MaxX > table->InnerClipRect.Max.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x + neighbor_width_to_keep_visible, 1.0f);
    }

    // Apply resizing/dragging at the end of the frame
    if (table->ResizedColumn != -1 && table->InstanceCurrent == table->InstanceInteracted)
    {
        ImGuiTableColumn* column = &table->Columns[table->ResizedColumn];
        const float new_x2 = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + TABLE_RESIZE_SEPARATOR_HALF_THICKNESS);
        const float new_width = ImFloor(new_x2 - column->MinX - table->CellSpacingX1 - table->CellPaddingX * 2.0f);
        table->ResizedColumnNextWidth = new_width;
    }

    // Pop from id stack
    IM_ASSERT_USER_ERROR(inner_window->IDStack.back() == table->ID + table->InstanceCurrent, "Mismatching PushID/PopID!");
    IM_ASSERT_USER_ERROR(outer_window->DC.ItemWidthStack.Size >= table->HostBackupItemWidthStackSize, "Too many PopItemWidth!");
    PopID();

    // Restore window data that we modified
    const ImVec2 backup_outer_max_pos = outer_window->DC.CursorMaxPos;
    inner_window->WorkRect = table->HostBackupWorkRect;
    inner_window->ParentWorkRect = table->HostBackupParentWorkRect;
    inner_window->SkipItems = table->HostSkipItems;
    outer_window->DC.CursorPos = table->OuterRect.Min;
    outer_window->DC.ItemWidth = table->HostBackupItemWidth;
    outer_window->DC.ItemWidthStack.Size = table->HostBackupItemWidthStackSize;
    outer_window->DC.ColumnsOffset = table->HostBackupColumnsOffset;

    // Layout in outer window
    // (FIXME: To allow auto-fit and allow desirable effect of SameLine() we dissociate 'used' vs 'ideal' size by overriding
    // CursorPosPrevLine and CursorMaxPos manually. That should be a more general layout feature, see same problem e.g. #3414)
    if (inner_window != outer_window)
    {
        EndChild();
    }
    else
    {
        ItemSize(table->OuterRect.GetSize());
        ItemAdd(table->OuterRect, 0);
    }

    // Override declared contents width/height to enable auto-resize while not needlessly adding a scrollbar
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        // FIXME-TABLE: Could we remove this section?
        // ColumnsAutoFitWidth may be one frame ahead here since for Fixed+NoResize is calculated from latest contents
        IM_ASSERT((table->Flags & ImGuiTableFlags_ScrollX) == 0);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth);
    }
    else if (table->UserOuterSize.x <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollX) ? inner_window->ScrollbarSizes.x : 0.0f;
        outer_window->DC.IdealMaxPos.x = ImMax(outer_window->DC.IdealMaxPos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth + decoration_size - table->UserOuterSize.x);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, ImMin(table->OuterRect.Max.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth));
    }
    else
    {
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Max.x);
    }
    if (table->UserOuterSize.y <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollY) ? inner_window->ScrollbarSizes.y : 0.0f;
        outer_window->DC.IdealMaxPos.y = ImMax(outer_window->DC.IdealMaxPos.y, inner_content_max_y + decoration_size - table->UserOuterSize.y);
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, ImMin(table->OuterRect.Max.y, inner_content_max_y));
    }
    else
    {
        // OuterRect.Max.y may already have been pushed downward from the initial value (unless ImGuiTableFlags_NoHostExtendY is set)
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, table->OuterRect.Max.y);
    }

    // Save settings
    if (table->IsSettingsDirty)
        TableSaveSettings(table);
    table->IsInitializing = false;

    // Clear or restore current table, if any
    IM_ASSERT(g.CurrentWindow == outer_window && g.CurrentTable == table);
    g.CurrentTableStack.pop_back();
    g.CurrentTable = g.CurrentTableStack.Size ? g.Tables.GetByIndex(g.CurrentTableStack.back().Index) : NULL;
    outer_window->DC.CurrentTableIdx = g.CurrentTable ? g.Tables.GetIndex(g.CurrentTable) : -1;
}